

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

_Bool object_curses_find_element(player *p,object *obj,wchar_t elem)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t local_80;
  wchar_t index;
  wchar_t i;
  _Bool new;
  char o_name [80];
  wchar_t elem_local;
  object *obj_local;
  player *p_local;
  
  index._3_1_ = false;
  object_desc((char *)&i,0x50,obj,0,p);
  if (obj->curses != (curse_data *)0x0) {
    for (local_80 = L'\x01'; local_80 < (int)(uint)z_info->curse_max; local_80 = local_80 + L'\x01')
    {
      wVar1 = rune_index(5,local_80);
      if (((obj->curses[local_80].power != L'\0') && (curses[local_80].obj != (object *)0x0)) &&
         ((curses[local_80].obj)->el_info[elem].res_level != 100)) {
        if (p->obj_k->el_info[elem].res_level == 0) {
          msg("Your %s glows.",&i);
          wVar2 = rune_index(2,elem);
          player_learn_rune(p,(long)wVar2,true);
        }
        if (L'\xffffffff' < wVar1) {
          player_learn_rune(p,(long)wVar1,true);
        }
        index._3_1_ = true;
      }
    }
  }
  return index._3_1_;
}

Assistant:

static bool object_curses_find_element(struct player *p, struct object *obj, int elem)
{
	char o_name[80];
	bool new = false;

	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, p);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			int index = rune_index(RUNE_VAR_CURSE, i);

			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			/* Does the object affect the player's resistance to the element? */
			if (curses[i].obj->el_info[elem].res_level != RES_LEVEL_BASE) {
				/* Learn the element properties if we don't know yet */
				if (!p->obj_k->el_info[elem].res_level) {
					msg("Your %s glows.", o_name);

					player_learn_rune(p, rune_index(RUNE_VAR_RESIST, elem),
									  true);
				}

				/* Learn the curse */
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
				new = true;
			}
		}
	}
	return new;
}